

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_parser.hpp
# Opt level: O0

SPIRExtension * __thiscall
spirv_cross::Parser::set<spirv_cross::SPIRExtension,spirv_cross::SPIRExtension::Extension&>
          (Parser *this,uint32_t id,Extension *args)

{
  Variant *var_00;
  TypedID<(spirv_cross::Types)0> local_34;
  SPIRExtension *local_30;
  SPIRExtension *var;
  Extension *local_20;
  Extension *args_local;
  Parser *pPStack_10;
  uint32_t id_local;
  Parser *this_local;
  
  local_20 = args;
  args_local._4_4_ = id;
  pPStack_10 = this;
  TypedID<(spirv_cross::Types)0>::TypedID((TypedID<(spirv_cross::Types)0> *)((long)&var + 4),id);
  ParsedIR::add_typed_id(&this->ir,TypeExtension,var._4_4_);
  var_00 = VectorView<spirv_cross::Variant>::operator[]
                     (&(this->ir).ids.super_VectorView<spirv_cross::Variant>,(ulong)args_local._4_4_
                     );
  local_30 = variant_set<spirv_cross::SPIRExtension,spirv_cross::SPIRExtension::Extension&>
                       (var_00,local_20);
  TypedID<(spirv_cross::Types)0>::TypedID(&local_34,args_local._4_4_);
  (local_30->super_IVariant).self.id = local_34.id;
  return local_30;
}

Assistant:

T &set(uint32_t id, P &&... args)
	{
		ir.add_typed_id(static_cast<Types>(T::type), id);
		auto &var = variant_set<T>(ir.ids[id], std::forward<P>(args)...);
		var.self = id;
		return var;
	}